

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArgument
          (CommandLineInterface *this,char *arg,string *name,string *value)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *equals_pos;
  bool parsed_value;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  char *local_38;
  byte local_29;
  string *local_28;
  string *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  bool local_1;
  
  local_29 = 0;
  local_28 = in_RCX;
  local_18 = in_RSI;
  if (in_RSI->_M_dataplus == (_Alloc_hider)0x2d) {
    local_20 = in_RDX;
    if (in_RSI->field_0x1 == '-') {
      local_38 = strchr((char *)in_RSI,0x3d);
      if (local_38 == (char *)0x0) {
        std::__cxx11::string::operator=(local_20,(char *)local_18);
      }
      else {
        uVar3 = (long)local_38 - (long)local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,(char *)local_18,uVar3,&local_59);
        std::__cxx11::string::operator=(local_20,local_58);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        std::__cxx11::string::operator=(local_28,local_38 + 1);
        local_29 = 1;
      }
    }
    else if (in_RSI->field_0x1 == '\0') {
      std::__cxx11::string::clear();
      std::__cxx11::string::operator=(local_28,(char *)local_18);
      local_29 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,(char *)in_RSI,2,&local_91);
      std::__cxx11::string::operator=(local_20,local_90);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      std::__cxx11::string::operator=(local_28,&local_18->field_0x2);
      bVar1 = std::__cxx11::string::empty();
      local_29 = (bVar1 ^ 0xff) & 1;
      in_stack_ffffffffffffff40 = in_RSI;
    }
  }
  else {
    std::__cxx11::string::clear();
    local_29 = 1;
    std::__cxx11::string::operator=(local_28,(char *)local_18);
  }
  if ((local_29 & 1) == 0) {
    bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (((((bVar2) ||
          (bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar2)) ||
         (bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar2)) ||
        ((bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar2 ||
         (bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar2)))) ||
       ((bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar2 ||
        ((bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar2 ||
         (bVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar2))))))
    {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CommandLineInterface::ParseArgument(const char* arg, std::string* name,
                                         std::string* value) {
  bool parsed_value = false;

  if (arg[0] != '-') {
    // Not a flag.
    name->clear();
    parsed_value = true;
    *value = arg;
  } else if (arg[1] == '-') {
    // Two dashes:  Multi-character name, with '=' separating name and
    //   value.
    const char* equals_pos = strchr(arg, '=');
    if (equals_pos != NULL) {
      *name = std::string(arg, equals_pos - arg);
      *value = equals_pos + 1;
      parsed_value = true;
    } else {
      *name = arg;
    }
  } else {
    // One dash:  One-character name, all subsequent characters are the
    //   value.
    if (arg[1] == '\0') {
      // arg is just "-".  We treat this as an input file, except that at
      // present this will just lead to a "file not found" error.
      name->clear();
      *value = arg;
      parsed_value = true;
    } else {
      *name = std::string(arg, 2);
      *value = arg + 2;
      parsed_value = !value->empty();
    }
  }

  // Need to return true iff the next arg should be used as the value for this
  // one, false otherwise.

  if (parsed_value) {
    // We already parsed a value for this flag.
    return false;
  }

  if (*name == "-h" || *name == "--help" || *name == "--disallow_services" ||
      *name == "--include_imports" || *name == "--include_source_info" ||
      *name == "--version" || *name == "--decode_raw" ||
      *name == "--print_free_field_numbers") {
    // HACK:  These are the only flags that don't take a value.
    //   They probably should not be hard-coded like this but for now it's
    //   not worth doing better.
    return false;
  }

  // Next argument is the flag value.
  return true;
}